

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractDOMParser::entityDecl
          (AbstractDOMParser *this,DTDEntityDecl *entityDecl,bool param_2,bool param_3)

{
  DOMDocumentImpl *pDVar1;
  XMLBuffer *this_00;
  bool bVar2;
  int iVar3;
  XMLCh *pXVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar6;
  XMLCh *id;
  DOMEntityImpl *previousDef;
  DOMEntityImpl *entity;
  bool param_3_local;
  bool param_2_local;
  DTDEntityDecl *entityDecl_local;
  AbstractDOMParser *this_local;
  long *plVar5;
  
  pDVar1 = this->fDocument;
  pXVar4 = XMLEntityDecl::getName(&entityDecl->super_XMLEntityDecl);
  iVar3 = (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x3a])(pDVar1,pXVar4);
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  pXVar4 = XMLEntityDecl::getPublicId(&entityDecl->super_XMLEntityDecl);
  (**(code **)(*plVar5 + 0x198))(plVar5,pXVar4);
  pXVar4 = XMLEntityDecl::getSystemId(&entityDecl->super_XMLEntityDecl);
  (**(code **)(*plVar5 + 0x1a0))(plVar5,pXVar4);
  pXVar4 = XMLEntityDecl::getNotationName(&entityDecl->super_XMLEntityDecl);
  (**(code **)(*plVar5 + 400))(plVar5,pXVar4);
  pXVar4 = XMLEntityDecl::getBaseURI(&entityDecl->super_XMLEntityDecl);
  (**(code **)(*plVar5 + 0x1b8))(plVar5,pXVar4);
  iVar3 = (*(this->fDocumentType->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0x29])();
  plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x10))
                             ((long *)CONCAT44(extraout_var_00,iVar3),plVar5);
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 0x138))();
  }
  bVar2 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar2) {
    XMLBuffer::append(this->fInternalSubset,L'<');
    XMLBuffer::append(this->fInternalSubset,L'!');
    XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgEntityString);
    XMLBuffer::append(this->fInternalSubset,L' ');
    this_00 = this->fInternalSubset;
    pXVar4 = XMLEntityDecl::getName(&entityDecl->super_XMLEntityDecl);
    XMLBuffer::append(this_00,pXVar4);
    pXVar4 = (XMLCh *)(**(code **)(*plVar5 + 0x140))();
    if (pXVar4 != (XMLCh *)0x0) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgPubIDString);
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,L'\"');
      XMLBuffer::append(this->fInternalSubset,pXVar4);
      XMLBuffer::append(this->fInternalSubset,L'\"');
    }
    pXVar4 = (XMLCh *)(**(code **)(*plVar5 + 0x148))();
    if (pXVar4 != (XMLCh *)0x0) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgSysIDString);
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,L'\"');
      XMLBuffer::append(this->fInternalSubset,pXVar4);
      XMLBuffer::append(this->fInternalSubset,L'\"');
    }
    pXVar4 = (XMLCh *)(**(code **)(*plVar5 + 0x150))();
    if (pXVar4 != (XMLCh *)0x0) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgNDATAString);
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,pXVar4);
    }
    pXVar4 = XMLEntityDecl::getValue(&entityDecl->super_XMLEntityDecl);
    if (pXVar4 != (XMLCh *)0x0) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,L'\"');
      XMLBuffer::append(this->fInternalSubset,pXVar4);
      XMLBuffer::append(this->fInternalSubset,L'\"');
    }
    XMLBuffer::append(this->fInternalSubset,L'>');
  }
  return;
}

Assistant:

void AbstractDOMParser::entityDecl
(
    const   DTDEntityDecl&  entityDecl
    , const bool
    , const bool
)
{
    DOMEntityImpl* entity = (DOMEntityImpl *) fDocument->createEntity(entityDecl.getName());

    entity->setPublicId(entityDecl.getPublicId());
    entity->setSystemId(entityDecl.getSystemId());
    entity->setNotationName(entityDecl.getNotationName());
    entity->setBaseURI(entityDecl.getBaseURI());

    DOMEntityImpl *previousDef = (DOMEntityImpl *)
	    fDocumentType->getEntities()->setNamedItem( entity );

    if (previousDef)
        previousDef->release();

    if (fDocumentType->isIntSubsetReading())
    {
        //add thes chars to internalSubset variable
        fInternalSubset.append(chOpenAngle);
        fInternalSubset.append(chBang);
        fInternalSubset.append(XMLUni::fgEntityString);
        fInternalSubset.append(chSpace);

        fInternalSubset.append(entityDecl.getName());

        const XMLCh* id = entity->getPublicId();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgPubIDString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);
        }
        id = entity->getSystemId();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgSysIDString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);

        }
        id = entity->getNotationName();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgNDATAString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(id);
        }
        id = entityDecl.getValue();
        if (id !=0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);
        }

        fInternalSubset.append(chCloseAngle);
    }

}